

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O1

Matrix4d *
opengv::relative_pose::modules::ge::composeG
          (Matrix4d *__return_storage_ptr__,Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,
          Matrix3d *yzF,Matrix3d *zxF,Matrix<double,_3,_9,_0,_3,_9> *x1P,
          Matrix<double,_3,_9,_0,_3,_9> *y1P,Matrix<double,_3,_9,_0,_3,_9> *z1P,
          Matrix<double,_3,_9,_0,_3,_9> *x2P,Matrix<double,_3,_9,_0,_3,_9> *y2P,
          Matrix<double,_3,_9,_0,_3,_9> *z2P,Matrix<double,_9,_9,_0,_9,_9> *m11P,
          Matrix<double,_9,_9,_0,_9,_9> *m12P,Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *cayley)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  double dVar54;
  double dVar55;
  double dVar56;
  ActualDstType actualDst;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  double dVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  Matrix<double,_1,_9,_1,_1,_9> Rows;
  Matrix<double,_9,_1,_0,_9,_1> Cols;
  Matrix<double,_9,_1,_0,_9,_1> Rowst;
  rotation_t R;
  Scalar local_440;
  Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> local_438;
  Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> local_430;
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  Matrix3d *local_408;
  double local_400;
  double local_3f8;
  ulong local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>_>
  local_3d0;
  double *local_3a8;
  double local_3a0;
  undefined1 local_398 [64];
  double local_358;
  Matrix<double,_9,_1,_0,_9,_1> local_348;
  undefined1 local_2f8 [16];
  double dStack_2e8;
  double dStack_2e0;
  double dStack_2d8;
  double dStack_2d0;
  double dStack_2c8;
  double dStack_2c0;
  double local_2b8;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double local_290;
  double dStack_288;
  double local_280;
  double local_278;
  double dStack_270;
  double local_268;
  non_const_type local_258;
  undefined1 local_250 [64];
  undefined8 local_210;
  Matrix<double,_9,_1,_0,_9,_1> *local_208;
  
  local_408 = xxF;
  math::cayley2rot_reduced(cayley);
  auVar112._8_8_ = dStack_2a0;
  auVar112._0_8_ = dStack_2a0;
  auVar119._8_8_ = dStack_288;
  auVar119._0_8_ = dStack_288;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dStack_270;
  auVar57 = vmovddup_avx512vl(auVar59);
  local_3e0 = (local_408->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[2];
  local_3d8 = (local_408->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[5];
  dVar2 = (local_408->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
          .array[8];
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar2;
  auVar58 = vmulsd_avx512f(auVar57,auVar98);
  auVar128._8_8_ = local_2a8;
  auVar128._0_8_ = local_2a8;
  auVar133._8_8_ = local_290;
  auVar133._0_8_ = local_290;
  auVar136._8_8_ = local_278;
  auVar136._0_8_ = local_278;
  dVar3 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar3;
  auVar150._8_8_ = 0;
  auVar150._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar59 = vmulsd_avx512f(auVar133,auVar150);
  dVar4 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [8];
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar4;
  dVar54 = local_2a8 * dVar3 + auVar59._0_8_ + local_278 * dVar4;
  dVar3 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  dVar4 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [5];
  dVar5 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [8];
  local_3e8 = local_2a8 * dVar3 + local_290 * dVar4 + local_278 * dVar5;
  dVar6 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  dVar7 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [5];
  dVar8 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [8];
  dVar55 = local_2a8 * dVar6 + local_278 * dVar8 + local_290 * dVar7;
  auVar59 = *(undefined1 (*) [16])
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array;
  auVar60 = vmulpd_avx512vl(auVar112,auVar59);
  auVar67 = *(undefined1 (*) [16])
             ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array + 3);
  auVar61 = vfmadd231pd_avx512vl(auVar60,auVar67,auVar119);
  auVar60 = *(undefined1 (*) [16])
             ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array + 6);
  auVar62 = vfmadd231pd_avx512vl(auVar61,auVar60,auVar57);
  auVar142._8_8_ = 0;
  auVar142._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar61 = vmulsd_avx512f(auVar112,auVar142);
  auVar147._8_8_ = 0;
  auVar147._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar63 = vmulsd_avx512f(auVar119,auVar147);
  auVar148._8_8_ = 0;
  auVar148._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar64 = vmulsd_avx512f(auVar57,auVar148);
  auVar63 = vaddsd_avx512f(auVar63,auVar64);
  auVar61 = vaddsd_avx512f(auVar61,auVar63);
  local_3f0 = auVar61._0_8_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_298;
  auVar61 = vmovddup_avx512vl(auVar61);
  auVar59 = vmulpd_avx512vl(auVar59,auVar61);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_280;
  auVar63 = vmovddup_avx512vl(auVar63);
  auVar59 = vfmadd231pd_avx512vl(auVar59,auVar63,auVar67);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = local_268;
  auVar65 = vmovddup_avx512vl(auVar67);
  auVar66 = vfmadd231pd_avx512vl(auVar59,auVar65,auVar60);
  auVar59 = vmulsd_avx512f(auVar142,auVar61);
  auVar67 = vmulsd_avx512f(auVar147,auVar63);
  auVar60 = vmulsd_avx512f(auVar148,auVar65);
  auVar67 = vaddsd_avx512f(auVar67,auVar60);
  auVar59 = vaddsd_avx512f(auVar59,auVar67);
  local_400 = auVar59._0_8_;
  auVar140._8_8_ = 0;
  auVar140._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar59 = vmulsd_avx512f(auVar119,auVar140);
  auVar149._8_8_ = 0;
  auVar149._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar67 = vmulsd_avx512f(auVar57,auVar149);
  auVar59 = vaddsd_avx512f(auVar59,auVar67);
  auVar151._8_8_ = 0;
  auVar151._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar67 = vmulsd_avx512f(auVar112,auVar151);
  auVar59 = vaddsd_avx512f(auVar67,auVar59);
  local_3f8 = auVar59._0_8_;
  auVar59 = *(undefined1 (*) [16])
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array;
  auVar60 = vmulpd_avx512vl(auVar112,auVar59);
  auVar67 = *(undefined1 (*) [16])
             ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array + 3);
  auVar60 = vfmadd231pd_avx512vl(auVar60,auVar67,auVar119);
  auVar59 = vmulpd_avx512vl(auVar61,auVar59);
  auVar67 = vfmadd231pd_avx512vl(auVar59,auVar63,auVar67);
  auVar59 = *(undefined1 (*) [16])
             ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array + 6);
  auVar68 = vfmadd231pd_avx512vl(auVar60,auVar59,auVar57);
  auVar59 = vfmadd231pd_avx512vl(auVar67,auVar65,auVar59);
  auVar67 = vmulsd_avx512f(auVar63,auVar140);
  auVar60 = vmulsd_avx512f(auVar65,auVar149);
  auVar67 = vaddsd_avx512f(auVar67,auVar60);
  auVar60 = vmulsd_avx512f(auVar61,auVar151);
  auVar67 = vaddsd_avx512f(auVar60,auVar67);
  auVar60 = vmulpd_avx512vl(auVar112,*(undefined1 (*) [16])
                                      (local_408->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                      m_storage.m_data.array);
  auVar60 = vfmadd231pd_avx512vl
                      (auVar60,auVar119,
                       *(undefined1 (*) [16])
                        ((local_408->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array + 3));
  auVar69 = vfmadd231pd_avx512vl
                      (auVar60,auVar57,
                       *(undefined1 (*) [16])
                        ((local_408->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array + 6));
  auVar60 = vmulpd_avx512vl(auVar128,*(undefined1 (*) [16])
                                      (yyF->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                      m_storage.m_data.array);
  auVar60 = vfmadd231pd_avx512vl
                      (auVar60,auVar133,
                       *(undefined1 (*) [16])
                        ((yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array + 3));
  auVar70 = vfmadd231pd_avx512vl
                      (auVar60,auVar136,
                       *(undefined1 (*) [16])
                        ((yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array + 6));
  auVar60 = vmulpd_avx512vl(auVar128,*(undefined1 (*) [16])
                                      (zzF->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                      m_storage.m_data.array);
  auVar60 = vfmadd231pd_avx512vl
                      (auVar60,auVar133,
                       *(undefined1 (*) [16])
                        ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array + 3));
  auVar71 = vfmadd231pd_avx512vl
                      (auVar60,auVar136,
                       *(undefined1 (*) [16])
                        ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array + 6));
  auVar60 = vmulpd_avx512vl(auVar128,*(undefined1 (*) [16])
                                      (yzF->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                      m_storage.m_data.array);
  auVar60 = vfmadd231pd_avx512vl
                      (auVar60,auVar133,
                       *(undefined1 (*) [16])
                        ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array + 3));
  auVar72 = vfmadd231pd_avx512vl
                      (auVar60,auVar136,
                       *(undefined1 (*) [16])
                        ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array + 6));
  auVar73 = vmulsd_avx512f(auVar88,auVar65);
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar60 = vmulsd_avx512f(auVar63,auVar60);
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar64 = vmulsd_avx512f(auVar61,auVar64);
  auVar74 = vmulsd_avx512f(auVar150,auVar65);
  auVar75._8_8_ = 0;
  auVar75._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar75 = vmulsd_avx512f(auVar63,auVar75);
  auVar75 = vaddsd_avx512f(auVar74,auVar75);
  auVar74._8_8_ = 0;
  auVar74._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar74 = vmulsd_avx512f(auVar61,auVar74);
  auVar75 = vaddsd_avx512f(auVar74,auVar75);
  auVar74 = vmulsd_avx512f(auVar107,auVar65);
  auVar76._8_8_ = 0;
  auVar76._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar76 = vmulsd_avx512f(auVar63,auVar76);
  auVar74 = vaddsd_avx512f(auVar74,auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar76 = vmulsd_avx512f(auVar61,auVar77);
  auVar74 = vaddsd_avx512f(auVar76,auVar74);
  auVar75 = vmulsd_avx512f(auVar63,auVar75);
  auVar74 = vmulsd_avx512f(auVar65,auVar74);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = auVar64._0_8_ + auVar60._0_8_ + auVar73._0_8_;
  auVar60 = vmulsd_avx512f(auVar61,auVar89);
  dVar56 = auVar60._0_8_ + auVar75._0_8_ + auVar74._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0] = dVar56;
  auVar64 = ZEXT816(0xc000000000000000);
  auVar60 = vmulsd_avx512f(auVar65,auVar64);
  dVar106 = auVar60._0_8_;
  auVar60 = vmulsd_avx512f(auVar63,auVar64);
  auVar64 = vmulsd_avx512f(auVar61,auVar64);
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar75 = vmulsd_avx512f(auVar64,auVar73);
  auVar96._8_8_ = 0;
  auVar96._0_8_ =
       auVar60._0_8_ *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
       + dVar6 * dVar106;
  auVar75 = vaddsd_avx512f(auVar75,auVar96);
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar74 = vmulsd_avx512f(auVar60,auVar78);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar7 * dVar106;
  auVar74 = vaddsd_avx512f(auVar99,auVar74);
  auVar79._8_8_ = 0;
  auVar79._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar76 = vmulsd_avx512f(auVar64,auVar79);
  auVar74 = vaddsd_avx512f(auVar76,auVar74);
  auVar102._8_8_ = 0;
  auVar102._0_8_ =
       auVar64._0_8_ *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       + dVar8 * dVar106 +
         auVar60._0_8_ *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7];
  auVar60 = vmulsd_avx512f(auVar57,auVar102);
  dVar56 = dVar56 + dStack_2a0 * auVar75._0_8_ + dStack_288 * auVar74._0_8_ + auVar60._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0] = dVar56;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar3;
  auVar60 = vmulsd_avx512f(auVar57,auVar80);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar4;
  auVar64 = vmulsd_avx512f(auVar57,auVar81);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar5;
  auVar75 = vmulsd_avx512f(auVar57,auVar82);
  auVar103._8_8_ = 0;
  auVar103._0_8_ =
       dStack_2a0 *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       + auVar75._0_8_ +
         dStack_288 *
         (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7];
  auVar75 = vmulsd_avx512f(auVar57,auVar103);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0] =
       dVar56 + dStack_2a0 *
                (dStack_2a0 *
                 (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0] +
                auVar60._0_8_ +
                dStack_288 *
                (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[1]) +
                dStack_288 *
                (dStack_2a0 *
                 (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3] +
                auVar64._0_8_ +
                dStack_288 *
                (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[4]) + auVar75._0_8_;
  auVar60 = vshufpd_avx512vl(auVar72,auVar72,1);
  auVar64 = vmulsd_avx512f(auVar60,auVar63);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar55;
  auVar75 = vmulsd_avx512f(auVar109,auVar65);
  auVar74 = vmulsd_avx512f(auVar72,auVar61);
  dVar3 = auVar74._0_8_ + auVar64._0_8_ + auVar75._0_8_;
  local_418 = vshufpd_avx512vl(auVar66,auVar66,1);
  auVar64 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
  auVar75 = vxorpd_avx512vl(auVar65,auVar64);
  auVar74 = vmulsd_avx512f(auVar63,local_418);
  auVar76 = vmulsd_avx512f(auVar61,auVar66);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[4] = dVar3;
  dVar3 = dVar3 + ((local_400 * auVar75._0_8_ - auVar74._0_8_) - auVar76._0_8_);
  auVar74 = vshufpd_avx512vl(auVar71,auVar71,1);
  auVar76 = vxorpd_avx512vl(auVar57,auVar64);
  auVar77 = vmulsd_avx512f(auVar112,auVar71);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[4] = dVar3;
  dVar3 = ((local_3e8 * auVar76._0_8_ - dStack_288 * auVar74._0_8_) - auVar77._0_8_) + dVar3;
  auVar77 = vshufpd_avx512vl(auVar59,auVar59,1);
  auVar73 = vmulsd_avx512f(auVar57,auVar67);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = dStack_288 * auVar77._0_8_;
  auVar73 = vaddsd_avx512f(auVar100,auVar73);
  auVar78 = vmulsd_avx512f(auVar112,auVar59);
  auVar73 = vaddsd_avx512f(auVar78,auVar73);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[4] = dVar3;
  dVar3 = dVar3 + auVar73._0_8_;
  auVar73 = vshufpd_avx512vl(auVar62,auVar62,1);
  auVar78 = vmulsd_avx512f(auVar73,auVar63);
  auVar152._8_8_ = 0;
  auVar152._0_8_ = local_3f0;
  auVar79 = vmulsd_avx512f(auVar65,auVar152);
  auVar78 = vaddsd_avx512f(auVar78,auVar79);
  auVar79 = vmulsd_avx512f(auVar62,auVar61);
  auVar78 = vaddsd_avx512f(auVar79,auVar78);
  local_428 = vshufpd_avx512vl(auVar70,auVar70,1);
  auVar79 = vmulsd_avx512f(local_428,auVar63);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = auVar75._0_8_ * dVar54;
  auVar75 = vsubsd_avx512f(auVar104,auVar79);
  auVar79 = vmulsd_avx512f(auVar70,auVar61);
  auVar75 = vsubsd_avx512f(auVar75,auVar79);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[4] = dVar3;
  pdVar1 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
           m_storage.m_data.array + 8;
  vmovsd_avx512f(auVar78);
  *pdVar1 = *pdVar1;
  auVar75 = vaddsd_avx512f(auVar78,auVar75);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = local_3f8;
  auVar76 = vmulsd_avx512f(auVar90,auVar76);
  auVar78 = vshufpd_avx512vl(auVar68,auVar68,1);
  auVar79 = vmulsd_avx512f(auVar119,auVar78);
  auVar76 = vsubsd_avx512f(auVar76,auVar79);
  auVar79 = vmulsd_avx512f(auVar112,auVar68);
  auVar76 = vsubsd_avx512f(auVar76,auVar79);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[8] = auVar75._0_8_;
  auVar75 = vaddsd_avx512f(auVar75,auVar76);
  auVar76 = vmulsd_avx512f(auVar57,auVar109);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = dStack_288 * auVar60._0_8_;
  auVar76 = vaddsd_avx512f(auVar120,auVar76);
  auVar79 = vmulsd_avx512f(auVar112,auVar72);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[8] = auVar75._0_8_;
  dVar4 = auVar79._0_8_ + auVar76._0_8_ + auVar75._0_8_;
  auVar75 = vmulsd_avx512f(auVar128,auVar71);
  dVar5 = auVar75._0_8_ + local_290 * auVar74._0_8_ + local_278 * local_3e8;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = local_2a8 + local_2a8;
  auVar59 = vmulsd_avx512f(auVar115,auVar59);
  auVar75 = vmulsd_avx512f(auVar133,ZEXT816(0xc000000000000000));
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[8] = dVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[5] = dVar5;
  dVar5 = dVar5 + ((auVar75._0_8_ * auVar77._0_8_ - (local_278 + local_278) * auVar67._0_8_) -
                  auVar59._0_8_);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[5] = dVar5;
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       (local_408->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[1];
  auVar59 = vmulsd_avx512f(auVar63,auVar57);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_3e0;
  auVar67 = vmulsd_avx512f(auVar65,auVar71);
  auVar83._8_8_ = 0;
  auVar83._0_8_ =
       (local_408->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[0];
  auVar75 = vmulsd_avx512f(auVar61,auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       (local_408->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[4];
  auVar74 = vmulsd_avx512f(auVar63,auVar84);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = local_3d8;
  auVar76 = vmulsd_avx512f(auVar65,auVar85);
  auVar86._8_8_ = 0;
  auVar86._0_8_ =
       (local_408->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[3];
  auVar77 = vmulsd_avx512f(auVar61,auVar86);
  auVar87._8_8_ = 0;
  auVar87._0_8_ =
       (local_408->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[7];
  auVar79 = vmulsd_avx512f(auVar63,auVar87);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar2;
  auVar80 = vmulsd_avx512f(auVar65,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (local_408->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
       array[6];
  auVar81 = vmulsd_avx512f(auVar61,auVar10);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = auVar75._0_8_ + auVar67._0_8_ + auVar59._0_8_;
  auVar59 = vmulsd_avx512f(auVar61,auVar116);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = auVar77._0_8_ + auVar76._0_8_ + auVar74._0_8_;
  auVar67 = vmulsd_avx512f(auVar63,auVar121);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = auVar81._0_8_ + auVar80._0_8_ + auVar79._0_8_;
  auVar61 = vmulsd_avx512f(auVar65,auVar124);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[5] = dVar5 + auVar59._0_8_ + auVar67._0_8_ + auVar61._0_8_;
  auVar59 = vshufpd_avx512vl(auVar69,auVar69,1);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = local_2a8;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = local_290;
  auVar67 = vmulsd_avx512f(auVar68,auVar117);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = local_278;
  dVar2 = auVar67._0_8_ + local_278 * local_3f8 + local_290 * auVar78._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[9] = dVar2;
  auVar67 = vxorpd_avx512vl(auVar134,auVar64);
  auVar61 = vmulsd_avx512f(auVar72,auVar117);
  dVar2 = dVar2 + ((auVar67._0_8_ * dVar55 - local_290 * auVar60._0_8_) - auVar61._0_8_);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[9] = dVar2;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = local_280;
  auVar122._8_8_ = local_268;
  auVar122._0_8_ = local_268;
  auVar75 = vxorpd_avx512vl(auVar122,auVar64);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = dStack_2a0 * local_3e0 + dStack_288 * local_3d8 + auVar58._0_8_;
  auVar67 = vmulsd_avx512f(auVar141,auVar75);
  auVar108._8_8_ = local_298;
  auVar108._0_8_ = local_298;
  auVar60 = vmulsd_avx512f(auVar69,auVar108);
  dVar2 = ((auVar67._0_8_ - auVar59._0_8_ * local_280) - auVar60._0_8_) + dVar2;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[9] = dVar2;
  auVar67 = vmulsd_avx512f(auVar66,auVar117);
  dVar2 = local_290 * (double)local_418._0_8_ + local_278 * local_400 + auVar67._0_8_ + dVar2;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[9] = dVar2;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = dStack_2a0;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = dStack_288;
  auVar67 = vmulsd_avx512f(auVar69,auVar110);
  auVar59 = vmulsd_avx512f(auVar59,auVar111);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = dStack_270;
  auVar60 = vmulsd_avx512f(auVar141,auVar113);
  auVar59 = vaddsd_avx512f(auVar59,auVar60);
  auVar59 = vaddsd_avx512f(auVar67,auVar59);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[10] = auVar59._0_8_;
  auVar67 = vaddsd_avx512f(auVar117,auVar117);
  auVar67 = vmulsd_avx512f(auVar62,auVar67);
  auVar60 = vmulsd_avx512f(auVar129,ZEXT816(0xc000000000000000));
  auVar60 = vmulsd_avx512f(auVar73,auVar60);
  auVar61 = vaddsd_avx512f(auVar134,auVar134);
  auVar61 = vmulsd_avx512f(auVar152,auVar61);
  auVar60 = vsubsd_avx512f(auVar60,auVar61);
  dVar5 = auVar59._0_8_ + (auVar60._0_8_ - auVar67._0_8_);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[10] = dVar5;
  auVar59 = vmulsd_avx512f(auVar70,auVar117);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[10] =
       auVar59._0_8_ + local_278 * dVar54 + local_290 * (double)local_428._0_8_ + dVar5;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[1] = dVar3;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[2] = dVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[6] = dVar2;
  auVar59 = vunpcklpd_avx(auVar108,auVar97);
  auVar67 = vunpcklpd_avx(auVar111,auVar113);
  auVar95._16_16_ = auVar59;
  auVar95._0_16_ = auVar67;
  auVar59 = vunpcklpd_avx(auVar117,auVar129);
  auVar67 = vunpcklpd_avx(auVar134,auVar110);
  local_398 = vinsertf64x4_avx512f(ZEXT3264(CONCAT1616(auVar67,auVar59)),auVar95,1);
  local_358 = (double)vmovlpd_avx(auVar122);
  local_2b8 = (double)vmovlpd_avx(auVar122);
  local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       local_2a8;
  local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[1] =
       dStack_2a0;
  local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       (double)vmovlpd_avx(auVar108);
  local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[3] =
       local_290;
  local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[4] =
       dStack_288;
  auVar91._8_8_ = local_280;
  auVar91._0_8_ = local_280;
  local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       (double)vmovlpd_avx(auVar91);
  local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[6] =
       local_278;
  local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[7] =
       dStack_270;
  auVar130._8_8_ = local_268;
  auVar130._0_8_ = local_268;
  local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[8] =
       (double)vmovlpd_avx(auVar130);
  auVar101._0_8_ =
       local_2a8 *
       (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[0]
  ;
  auVar101._8_8_ =
       local_2a8 *
       (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[1]
  ;
  auVar137._8_8_ = dStack_2a0;
  auVar137._0_8_ = dStack_2a0;
  auVar59 = vfmadd231pd_fma(auVar101,auVar137,
                            *(undefined1 (*) [16])
                             ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 3));
  auVar59 = vfmadd231pd_fma(auVar59,auVar108,
                            *(undefined1 (*) [16])
                             ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 6));
  auVar58._8_8_ = 0;
  auVar58._0_8_ = local_290;
  auVar63 = vmovddup_avx512vl(auVar58);
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar63,
                       *(undefined1 (*) [16])
                        ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 9));
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dStack_288;
  auVar74 = vmovddup_avx512vl(auVar62);
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar74,
                       *(undefined1 (*) [16])
                        ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xc));
  auVar59 = vfmadd231pd_fma(auVar59,auVar91,
                            *(undefined1 (*) [16])
                             ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 0xf));
  auVar65._8_8_ = 0;
  auVar65._0_8_ = local_278;
  auVar76 = vmovddup_avx512vl(auVar65);
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar76,
                       *(undefined1 (*) [16])
                        ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x12));
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dStack_270;
  auVar77 = vmovddup_avx512vl(auVar66);
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar77,
                       *(undefined1 (*) [16])
                        ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x15));
  auVar60 = vfmadd231pd_fma(auVar59,auVar130,
                            *(undefined1 (*) [16])
                             ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 0x18));
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xb];
  auVar59 = vmulsd_avx512f(auVar63,auVar68);
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xe];
  auVar67 = vmulsd_avx512f(auVar74,auVar69);
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x14];
  auVar61 = vmulsd_avx512f(auVar76,auVar70);
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x17];
  auVar73 = vmulsd_avx512f(auVar77,auVar72);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x1a];
  auVar78 = vmulsd_avx512f(auVar130,auVar11);
  auVar73 = vaddsd_avx512f(auVar73,auVar78);
  dVar5 = auVar67._0_8_ +
          local_280 *
          (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
          [0x11] + auVar61._0_8_ + auVar73._0_8_ +
          local_298 *
          (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
          [8] + auVar59._0_8_ +
          dStack_2a0 *
          (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
          [5] + local_2a8 *
                (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data
                .array[2];
  auVar105._0_8_ =
       local_2a8 *
       (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[0]
  ;
  auVar105._8_8_ =
       local_2a8 *
       (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[1]
  ;
  auVar59 = vfmadd231pd_fma(auVar105,auVar137,
                            *(undefined1 (*) [16])
                             ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 3));
  auVar59 = vfmadd231pd_fma(auVar59,auVar108,
                            *(undefined1 (*) [16])
                             ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 6));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar63,
                       *(undefined1 (*) [16])
                        ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 9));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar74,
                       *(undefined1 (*) [16])
                        ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xc));
  auVar59 = vfmadd231pd_fma(auVar59,auVar91,
                            *(undefined1 (*) [16])
                             ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 0xf));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar76,
                       *(undefined1 (*) [16])
                        ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x12));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar77,
                       *(undefined1 (*) [16])
                        ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x15));
  auVar61 = vfmadd231pd_fma(auVar59,auVar130,
                            *(undefined1 (*) [16])
                             ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 0x18));
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xb];
  auVar59 = vmulsd_avx512f(auVar63,auVar12);
  auVar125._8_8_ = 0;
  auVar125._0_8_ =
       local_298 *
       (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[8]
  ;
  auVar59 = vaddsd_avx512f(auVar125,auVar59);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xe];
  auVar67 = vmulsd_avx512f(auVar74,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x11];
  auVar73 = vmulsd_avx512f(auVar91,auVar14);
  auVar67 = vaddsd_avx512f(auVar67,auVar73);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x14];
  auVar73 = vmulsd_avx512f(auVar76,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x17];
  auVar78 = vmulsd_avx512f(auVar77,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x1a];
  auVar79 = vmulsd_avx512f(auVar130,auVar17);
  auVar78 = vaddsd_avx512f(auVar78,auVar79);
  auVar73 = vaddsd_avx512f(auVar73,auVar78);
  auVar67 = vaddsd_avx512f(auVar67,auVar73);
  dVar6 = local_2a8 *
          (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
          [2] + dStack_2a0 *
                (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data
                .array[5] + auVar59._0_8_ + auVar67._0_8_;
  auVar126._0_8_ =
       local_2a8 *
       (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[0]
  ;
  auVar126._8_8_ =
       local_2a8 *
       (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[1]
  ;
  auVar59 = vfmadd231pd_fma(auVar126,auVar137,
                            *(undefined1 (*) [16])
                             ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 3));
  auVar59 = vfmadd231pd_fma(auVar59,auVar108,
                            *(undefined1 (*) [16])
                             ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 6));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar63,
                       *(undefined1 (*) [16])
                        ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 9));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar74,
                       *(undefined1 (*) [16])
                        ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xc));
  auVar59 = vfmadd231pd_fma(auVar59,auVar91,
                            *(undefined1 (*) [16])
                             ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 0xf));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar76,
                       *(undefined1 (*) [16])
                        ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x12));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar77,
                       *(undefined1 (*) [16])
                        ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x15));
  auVar67 = vfmadd231pd_fma(auVar59,auVar130,
                            *(undefined1 (*) [16])
                             ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 0x18));
  dVar2 = (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
          [2];
  dVar3 = (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
          [5];
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xb];
  auVar59 = vmulsd_avx512f(auVar63,auVar18);
  auVar138._8_8_ = 0;
  auVar138._0_8_ =
       local_298 *
       (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[8]
  ;
  auVar73 = vaddsd_avx512f(auVar138,auVar59);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xe];
  auVar74 = vmulsd_avx512f(auVar74,auVar19);
  dVar4 = (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
          [0x11];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x14];
  auVar76 = vmulsd_avx512f(auVar76,auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x17];
  auVar59 = vmulsd_avx512f(auVar77,auVar21);
  auVar131._8_8_ = 0;
  auVar131._0_8_ =
       local_268 *
       (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x1a];
  auVar77 = vaddsd_avx512f(auVar59,auVar131);
  local_2f8._0_8_ = local_398._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_2f8._0_8_;
  auVar59 = vmovddup_avx512vl(auVar22);
  local_2f8._8_8_ = local_398._8_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_2f8._8_8_;
  auVar63 = vmovddup_avx512vl(auVar23);
  dStack_2e8 = local_398._16_8_;
  auVar92._8_8_ = dStack_2e8;
  auVar92._0_8_ = dStack_2e8;
  dStack_2e0 = local_398._24_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dStack_2e0;
  auVar78 = vmovddup_avx512vl(auVar24);
  dStack_2d8 = local_398._32_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dStack_2d8;
  auVar79 = vmovddup_avx512vl(auVar25);
  dStack_2d0 = local_398._40_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dStack_2d0;
  auVar80 = vmovddup_avx512vl(auVar26);
  dStack_2c8 = local_398._48_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dStack_2c8;
  auVar81 = vmovddup_avx512vl(auVar27);
  dStack_2c0 = local_398._56_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dStack_2c0;
  auVar82 = vmovddup_avx512vl(auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[2]
  ;
  auVar57 = vmulsd_avx512f(auVar59,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[5]
  ;
  auVar71 = vmulsd_avx512f(auVar63,auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xb];
  auVar83 = vmulsd_avx512f(auVar78,auVar31);
  auVar139._8_8_ = 0;
  auVar139._0_8_ =
       dStack_2e8 *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[8]
  ;
  auVar83 = vaddsd_avx512f(auVar139,auVar83);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xe];
  auVar84 = vmulsd_avx512f(auVar79,auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x11];
  auVar85 = vmulsd_avx512f(auVar80,auVar33);
  auVar84 = vaddsd_avx512f(auVar84,auVar85);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x14];
  auVar85 = vmulsd_avx512f(auVar81,auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x17];
  auVar86 = vmulsd_avx512f(auVar82,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x1a];
  auVar87 = vmulsd_avx512f(auVar122,auVar36);
  auVar86 = vaddsd_avx512f(auVar86,auVar87);
  auVar85 = vaddsd_avx512f(auVar85,auVar86);
  auVar84 = vaddsd_avx512f(auVar84,auVar85);
  dVar7 = auVar57._0_8_ + auVar71._0_8_ + auVar83._0_8_ + auVar84._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[2]
  ;
  auVar57 = vmulsd_avx512f(auVar59,auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[5]
  ;
  auVar71 = vmulsd_avx512f(auVar63,auVar38);
  auVar57 = vaddsd_avx512f(auVar57,auVar71);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[8]
  ;
  auVar71 = vmulsd_avx512f(auVar92,auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xb];
  auVar83 = vmulsd_avx512f(auVar78,auVar40);
  auVar71 = vaddsd_avx512f(auVar71,auVar83);
  auVar57 = vaddsd_avx512f(auVar57,auVar71);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xe];
  auVar71 = vmulsd_avx512f(auVar79,auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x11];
  auVar83 = vmulsd_avx512f(auVar80,auVar42);
  auVar71 = vaddsd_avx512f(auVar71,auVar83);
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x17];
  auVar83 = vmulsd_avx512f(auVar82,auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x1a];
  auVar84 = vmulsd_avx512f(auVar122,auVar44);
  auVar83 = vaddsd_avx512f(auVar83,auVar84);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x14];
  auVar84 = vmulsd_avx512f(auVar81,auVar45);
  auVar83 = vaddsd_avx512f(auVar84,auVar83);
  auVar84 = vmulpd_avx512vl(auVar59,*(undefined1 (*) [16])
                                     (x2P->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                                     m_storage.m_data.array);
  auVar84 = vfmadd231pd_avx512vl
                      (auVar84,auVar63,
                       *(undefined1 (*) [16])
                        ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 3));
  auVar71 = vaddsd_avx512f(auVar71,auVar83);
  auVar83 = vmulpd_avx512vl(auVar59,*(undefined1 (*) [16])
                                     (y2P->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                                     m_storage.m_data.array);
  auVar83 = vfmadd231pd_avx512vl
                      (auVar83,auVar63,
                       *(undefined1 (*) [16])
                        ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 3));
  auVar57 = vaddsd_avx512f(auVar57,auVar71);
  auVar71 = vmulpd_avx512vl(auVar59,*(undefined1 (*) [16])
                                     (z2P->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                                     m_storage.m_data.array);
  auVar71 = vfmadd231pd_avx512vl
                      (auVar71,auVar63,
                       *(undefined1 (*) [16])
                        ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 3));
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[2]
  ;
  auVar59 = vmulsd_avx512f(auVar59,auVar46);
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[5]
  ;
  auVar63 = vmulsd_avx512f(auVar63,auVar47);
  auVar85 = vaddsd_avx512f(auVar59,auVar63);
  auVar59 = vfmadd231pd_avx512vl
                      (auVar84,auVar92,
                       *(undefined1 (*) [16])
                        ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 6));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar78,
                       *(undefined1 (*) [16])
                        ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 9));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar79,
                       *(undefined1 (*) [16])
                        ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xc));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar80,
                       *(undefined1 (*) [16])
                        ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xf));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar81,
                       *(undefined1 (*) [16])
                        ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x12));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar82,
                       *(undefined1 (*) [16])
                        ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x15));
  auVar84 = vfmadd231pd_avx512vl
                      (auVar59,auVar122,
                       *(undefined1 (*) [16])
                        ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x18));
  auVar59 = vfmadd231pd_fma(auVar83,auVar92,
                            *(undefined1 (*) [16])
                             ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 6));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar78,
                       *(undefined1 (*) [16])
                        ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 9));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar79,
                       *(undefined1 (*) [16])
                        ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xc));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar80,
                       *(undefined1 (*) [16])
                        ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xf));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar81,
                       *(undefined1 (*) [16])
                        ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x12));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar82,
                       *(undefined1 (*) [16])
                        ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x15));
  auVar63 = vfmadd231pd_fma(auVar59,auVar122,
                            *(undefined1 (*) [16])
                             ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 0x18));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar71,auVar92,
                       *(undefined1 (*) [16])
                        ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 6));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar78,
                       *(undefined1 (*) [16])
                        ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 9));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar79,
                       *(undefined1 (*) [16])
                        ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xc));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar80,
                       *(undefined1 (*) [16])
                        ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xf));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar81,
                       *(undefined1 (*) [16])
                        ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x12));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar82,
                       *(undefined1 (*) [16])
                        ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x15));
  auVar71 = vfmadd231pd_avx512vl
                      (auVar59,auVar122,
                       *(undefined1 (*) [16])
                        ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x18));
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xb];
  auVar59 = vmulsd_avx512f(auVar78,auVar48);
  auVar93._8_8_ = 0;
  auVar93._0_8_ =
       dStack_2e8 *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[8]
  ;
  auVar59 = vaddsd_avx512f(auVar93,auVar59);
  auVar59 = vaddsd_avx512f(auVar85,auVar59);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xe];
  auVar78 = vmulsd_avx512f(auVar79,auVar49);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x11];
  auVar79 = vmulsd_avx512f(auVar80,auVar50);
  auVar78 = vaddsd_avx512f(auVar78,auVar79);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x14];
  auVar79 = vmulsd_avx512f(auVar81,auVar51);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x17];
  auVar80 = vmulsd_avx512f(auVar82,auVar52);
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x1a];
  auVar81 = vmulsd_avx512f(auVar122,auVar53);
  auVar80 = vaddsd_avx512f(auVar80,auVar81);
  auVar79 = vaddsd_avx512f(auVar79,auVar80);
  auVar78 = vaddsd_avx512f(auVar78,auVar79);
  auVar78 = vaddsd_avx512f(auVar59,auVar78);
  auVar79 = vshufpd_avx512vl(auVar61,auVar61,1);
  auVar59 = vmulsd_avx512f(auVar97,auVar79);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = dVar6;
  auVar80 = vmulsd_avx512f(auVar122,auVar118);
  auVar59 = vaddsd_avx512f(auVar59,auVar80);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = local_298 * auVar61._0_8_;
  auVar80 = vaddsd_avx512f(auVar94,auVar59);
  pdVar1 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
           m_storage.m_data.array + 0xc;
  vmovsd_avx512f(auVar80);
  *pdVar1 = *pdVar1;
  auVar81 = vmulsd_avx512f(auVar108,auVar63);
  auVar59 = vshufpd_avx(auVar63,auVar63,1);
  auVar82 = vmulsd_avx512f(auVar97,auVar59);
  auVar83 = vmulsd_avx512f(auVar122,auVar57);
  auVar82 = vaddsd_avx512f(auVar82,auVar83);
  auVar81 = vaddsd_avx512f(auVar81,auVar82);
  auVar80 = vaddsd_avx512f(auVar80,auVar81);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xc] = auVar80._0_8_;
  auVar81 = vshufpd_avx512vl(auVar67,auVar67,1);
  auVar82 = vxorpd_avx512vl(auVar113,auVar64);
  auVar132._8_8_ = 0;
  auVar132._0_8_ =
       local_2a8 * dVar2 + dStack_2a0 * dVar3 + auVar73._0_8_ +
       auVar76._0_8_ + auVar77._0_8_ + auVar74._0_8_ + local_280 * dVar4;
  auVar74 = vmulsd_avx512f(auVar132,auVar82);
  auVar76 = vmulsd_avx512f(auVar111,auVar81);
  auVar74 = vsubsd_avx512f(auVar74,auVar76);
  auVar76 = vmulsd_avx512f(auVar110,auVar67);
  auVar74 = vsubsd_avx512f(auVar74,auVar76);
  auVar74 = vaddsd_avx512f(auVar74,auVar80);
  auVar76 = vshufpd_avx512vl(auVar71,auVar71,1);
  auVar77 = vmulsd_avx512f(auVar78,auVar82);
  auVar73 = vmulsd_avx512f(auVar111,auVar76);
  auVar77 = vsubsd_avx512f(auVar77,auVar73);
  auVar73 = vmulsd_avx512f(auVar110,auVar71);
  auVar77 = vsubsd_avx512f(auVar77,auVar73);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xc] = auVar74._0_8_;
  auVar74 = vaddsd_avx512f(auVar74,auVar77);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xc] = auVar74._0_8_;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = local_290;
  auVar74 = vmulsd_avx512f(auVar81,auVar123);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = local_278;
  auVar77 = vmulsd_avx512f(auVar132,auVar145);
  auVar74 = vaddsd_avx512f(auVar74,auVar77);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = local_2a8;
  auVar67 = vmulsd_avx512f(auVar67,auVar143);
  dVar2 = auVar67._0_8_ + auVar74._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xd] = dVar2;
  auVar67 = vmulsd_avx512f(auVar71,auVar143);
  auVar74 = vmulsd_avx512f(auVar76,auVar123);
  auVar76 = vmulsd_avx512f(auVar78,auVar145);
  auVar74 = vaddsd_avx512f(auVar74,auVar76);
  auVar67 = vaddsd_avx512f(auVar67,auVar74);
  dVar2 = dVar2 + auVar67._0_8_;
  auVar67 = vshufpd_avx(auVar60,auVar60,1);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = dVar5;
  auVar74 = vmulsd_avx512f(auVar114,auVar75);
  auVar76 = vmulsd_avx512f(auVar97,auVar67);
  auVar74 = vsubsd_avx512f(auVar74,auVar76);
  auVar76 = vmulsd_avx512f(auVar108,auVar60);
  auVar74 = vsubsd_avx512f(auVar74,auVar76);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xd] = dVar2;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = dVar2;
  auVar74 = vaddsd_avx512f(auVar74,auVar127);
  auVar76 = vshufpd_avx512vl(auVar84,auVar84,1);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = dVar7;
  auVar75 = vmulsd_avx512f(auVar135,auVar75);
  auVar77 = vmulsd_avx512f(auVar97,auVar76);
  auVar75 = vsubsd_avx512f(auVar75,auVar77);
  auVar77 = vmulsd_avx512f(auVar108,auVar84);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xd] = auVar74._0_8_;
  dVar3 = auVar74._0_8_ + (auVar75._0_8_ - auVar77._0_8_);
  dVar4 = dStack_2a0 * auVar60._0_8_ + auVar67._0_8_ * dStack_288 + dStack_270 * dVar5;
  auVar67 = vmulsd_avx512f(auVar110,auVar84);
  auVar60 = vmulsd_avx512f(auVar111,auVar76);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xd] = dVar3;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xe] = dVar4;
  dVar4 = dVar4 + auVar67._0_8_ + auVar60._0_8_ + dStack_270 * dVar7;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = local_278;
  auVar67 = vxorpd_avx512vl(auVar146,auVar64);
  auVar60 = vmulsd_avx512f(auVar79,auVar123);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = local_2a8;
  auVar61 = vmulsd_avx512f(auVar61,auVar144);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xe] = dVar4;
  dVar4 = dVar4 + ((dVar6 * auVar67._0_8_ - auVar60._0_8_) - auVar61._0_8_);
  auVar67 = vmulsd_avx512f(auVar57,auVar67);
  auVar60 = vmulsd_avx512f(auVar63,auVar144);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xe] = dVar4;
  dVar4 = ((auVar67._0_8_ - local_290 * auVar59._0_8_) - auVar60._0_8_) + dVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xe] = dVar4;
  local_250._0_16_ = ZEXT816(0);
  local_250 = ZEXT1664(local_250._0_16_);
  local_210 = 0;
  local_440 = 1.0;
  local_438.m_matrix = m11P;
  local_3d0.m_matrix.m_lhs.m_functor.m_other = -1.0;
  local_430.m_matrix = (non_const_type)local_250;
  local_3d0.m_matrix.m_rhs.m_matrix = &local_348;
  local_3a8 = &local_3a0;
  _local_2f8 = local_398;
  local_258 = (non_const_type)local_250;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            (&local_438,&local_3d0,&local_430,&local_440);
  local_3a0 = (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[8] *
              local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[2] *
              local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[4] *
              local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[6] *
              local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[1] *
              local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[3] *
              local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[5] *
              local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[7] *
              local_348.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  dVar2 = *local_3a8;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xf] = dVar2;
  local_250 = ZEXT864(0) << 0x20;
  local_210 = 0;
  local_440 = 1.0;
  local_438.m_matrix = m22P;
  local_3d0.m_matrix.m_lhs.m_functor.m_other = -1.0;
  local_3d0.m_matrix.m_rhs.m_matrix = (non_const_type)local_398;
  local_430.m_matrix = (non_const_type)local_250;
  local_3a8 = &local_3a0;
  local_258 = (non_const_type)local_250;
  local_208 = &local_348;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            (&local_438,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)&local_3d0,&local_430,&local_440);
  local_208 = (Matrix<double,_9,_1,_0,_9,_1> *)local_2f8;
  local_3a0 = (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[8] * local_2b8 +
              (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * (double)local_2f8._0_8_ +
              (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[2] * dStack_2e8 +
              (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[4] * dStack_2d8 +
              (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[6] * dStack_2c8 +
              (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[1] * (double)local_2f8._8_8_ +
              (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[3] * dStack_2e0 +
              (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[5] * dStack_2d0 +
              (local_258->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[7] * dStack_2c0;
  dVar2 = dVar2 + *local_3a8;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xf] = dVar2;
  local_250._0_16_ = ZEXT816(0);
  local_250 = ZEXT1664(local_250._0_16_);
  local_210 = 0;
  local_440 = 1.0;
  local_438.m_matrix = m12P;
  local_3d0.m_matrix.m_lhs.m_functor.m_other = -2.0;
  local_3d0.m_matrix.m_rhs.m_matrix = (non_const_type)local_398;
  local_430.m_matrix = (non_const_type)local_250;
  local_3a8 = &local_3a0;
  local_258 = (non_const_type)local_250;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            (&local_438,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)&local_3d0,&local_430,&local_440);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xf] = dVar2 + *local_3a8;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[3] =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
       m_storage.m_data.array[0xc];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[7] = dVar3;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xb] = dVar4;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix4d
opengv::relative_pose::modules::ge::composeG(
  const Eigen::Matrix3d & xxF,
  const Eigen::Matrix3d & yyF,
  const Eigen::Matrix3d & zzF,
  const Eigen::Matrix3d & xyF,
  const Eigen::Matrix3d & yzF,
  const Eigen::Matrix3d & zxF,
  const Eigen::Matrix<double,3,9> & x1P,
  const Eigen::Matrix<double,3,9> & y1P,
  const Eigen::Matrix<double,3,9> & z1P,
  const Eigen::Matrix<double,3,9> & x2P,
  const Eigen::Matrix<double,3,9> & y2P,
  const Eigen::Matrix<double,3,9> & z2P,
  const Eigen::Matrix<double,9,9> & m11P,
  const Eigen::Matrix<double,9,9> & m12P,
  const Eigen::Matrix<double,9,9> & m22P,
  const cayley_t & cayley)
{
  Eigen::Matrix4d G;
  rotation_t R = math::cayley2rot_reduced(cayley);

  //todo: Fill the matrix G using the precomputed summation terms
  Eigen::Vector3d xxFr1t = xxF*R.row(1).transpose();
  Eigen::Vector3d yyFr0t = yyF*R.row(0).transpose();
  Eigen::Vector3d zzFr0t = zzF*R.row(0).transpose();
  Eigen::Vector3d yzFr0t = yzF*R.row(0).transpose();
  Eigen::Vector3d xyFr1t = xyF*R.row(1).transpose();
  Eigen::Vector3d xyFr2t = xyF*R.row(2).transpose();
  Eigen::Vector3d zxFr1t = zxF*R.row(1).transpose();
  Eigen::Vector3d zxFr2t = zxF*R.row(2).transpose();
  
  double temp;
  temp =      R.row(2)*yyF*R.row(2).transpose();
  G(0,0)  = temp;
  temp = -2.0*R.row(2)*yzF*R.row(1).transpose();
  G(0,0) += temp;
  temp =      R.row(1)*zzF*R.row(1).transpose();
  G(0,0) += temp;

  temp =      R.row(2)*yzFr0t;
  G(0,1)  = temp;
  temp = -1.0*R.row(2)*xyFr2t;
  G(0,1) += temp;
  temp = -1.0*R.row(1)*zzFr0t;
  G(0,1) += temp;
  temp =      R.row(1)*zxFr2t;
  G(0,1) += temp;

  temp =      R.row(2)*xyFr1t;
  G(0,2)  = temp;
  temp = -1.0*R.row(2)*yyFr0t;
  G(0,2) += temp;
  temp = -1.0*R.row(1)*zxFr1t;
  G(0,2) += temp;
  temp =      R.row(1)*yzFr0t;
  G(0,2) += temp;

  temp =      R.row(0)*zzFr0t;
  G(1,1)  = temp;
  temp = -2.0*R.row(0)*zxFr2t;
  G(1,1) += temp;
  temp =      R.row(2)*xxF*R.row(2).transpose();
  G(1,1) += temp;

  temp =      R.row(0)*zxFr1t;
  G(1,2)  = temp;
  temp = -1.0*R.row(0)*yzFr0t;
  G(1,2) += temp;
  temp = -1.0*R.row(2)*xxFr1t;
  G(1,2) += temp;
  temp =      R.row(0)*xyFr2t;
  G(1,2) += temp;

  temp =      R.row(1)*xxFr1t;
  G(2,2)  = temp;
  temp = -2.0*R.row(0)*xyFr1t;
  G(2,2) += temp;
  temp =      R.row(0)*yyFr0t;
  G(2,2) += temp;

  G(1,0) = G(0,1);
  G(2,0) = G(0,2);
  G(2,1) = G(1,2);

  //the generalized terms:
  Eigen::Matrix<double,1,9> Rows;
  Rows.block<1,3>(0,0) = R.row(0);
  Rows.block<1,3>(0,3) = R.row(1);
  Rows.block<1,3>(0,6) = R.row(2);
  Eigen::Matrix<double,9,1> Rowst = Rows.transpose();
  
  Eigen::Matrix<double,9,1> Cols;
  Cols.block<3,1>(0,0) = R.col(0);
  Cols.block<3,1>(3,0) = R.col(1);
  Cols.block<3,1>(6,0) = R.col(2);
  
  Eigen::Vector3d x1PC = x1P*Cols;
  Eigen::Vector3d y1PC = y1P*Cols;
  Eigen::Vector3d z1PC = z1P*Cols;
  
  Eigen::Vector3d x2PR = x2P*Rowst;
  Eigen::Vector3d y2PR = y2P*Rowst;
  Eigen::Vector3d z2PR = z2P*Rowst;
  
  temp =      R.row(2)*y1PC;
  G(0,3)  = temp;
  temp =      R.row(2)*y2PR;
  G(0,3) += temp;
  temp = -1.0*R.row(1)*z1PC;
  G(0,3) += temp;
  temp = -1.0*R.row(1)*z2PR;
  G(0,3) += temp;
  
  temp =      R.row(0)*z1PC;
  G(1,3)  = temp;
  temp =      R.row(0)*z2PR;
  G(1,3) += temp;
  temp = -1.0*R.row(2)*x1PC;
  G(1,3) += temp;
  temp = -1.0*R.row(2)*x2PR;
  G(1,3) += temp;
  
  temp =      R.row(1)*x1PC;
  G(2,3)  = temp;
  temp =      R.row(1)*x2PR;
  G(2,3) += temp;
  temp = -1.0*R.row(0)*y1PC;
  G(2,3) += temp;
  temp = -1.0*R.row(0)*y2PR;
  G(2,3) += temp;
  
  temp = -1.0*Cols.transpose()*m11P*Cols;
  G(3,3)  = temp;
  temp = -1.0*Rows*m22P*Rowst;
  G(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols;
  G(3,3) += temp;
  
  G(3,0) = G(0,3);
  G(3,1) = G(1,3);
  G(3,2) = G(2,3);

  return G;
}